

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_huffman(huffman_conflict *hf,uint rbits)

{
  wchar_t c;
  uint rbits_local;
  huffman_conflict *hf_local;
  
  hf_local._4_4_ = (wchar_t)hf->tbl[rbits >> ((byte)hf->shift_bits & 0x1f)];
  if (hf->len_avail <= hf_local._4_4_) {
    hf_local._4_4_ = lzh_decode_huffman_tree(hf,rbits,hf_local._4_4_);
  }
  return hf_local._4_4_;
}

Assistant:

static inline int
lzh_decode_huffman(struct huffman *hf, unsigned rbits)
{
	int c;
	/*
	 * At first search an index table for a bit pattern.
	 * If it fails, search a huffman tree for.
	 */
	c = hf->tbl[rbits >> hf->shift_bits];
	if (c < hf->len_avail)
		return (c);
	/* This bit pattern needs to be found out at a huffman tree. */
	return (lzh_decode_huffman_tree(hf, rbits, c));
}